

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiheadattention.cpp
# Opt level: O1

int __thiscall ncnn::MultiHeadAttention::load_model(MultiHeadAttention *this,ModelBin *mb)

{
  Mat *pMVar1;
  int *piVar2;
  void *pvVar3;
  Allocator *pAVar4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  float *local_78;
  int *piStack_70;
  size_t local_68;
  int local_60;
  Allocator *local_58;
  int local_50;
  int iStack_4c;
  int iStack_48;
  int iStack_44;
  int local_40;
  size_t local_38;
  
  uVar5 = (long)this->weight_data_size / (long)this->embed_dim;
  iVar6 = (int)uVar5;
  (*mb->_vptr_ModelBin[2])(&local_78,mb,(ulong)(uint)(this->embed_dim * iVar6),0);
  pMVar1 = &this->q_weight_data;
  if (pMVar1 != (Mat *)&local_78) {
    if (piStack_70 != (int *)0x0) {
      LOCK();
      *piStack_70 = *piStack_70 + 1;
      UNLOCK();
    }
    piVar2 = (this->q_weight_data).refcount;
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        pvVar3 = (this->q_weight_data).data;
        pAVar4 = (this->q_weight_data).allocator;
        if (pAVar4 == (Allocator *)0x0) {
          if (pvVar3 != (void *)0x0) {
            free(pvVar3);
          }
        }
        else {
          (*pAVar4->_vptr_Allocator[3])();
        }
      }
    }
    (this->q_weight_data).cstep = 0;
    *(undefined8 *)((long)&(this->q_weight_data).refcount + 4) = 0;
    *(undefined8 *)((long)&(this->q_weight_data).elemsize + 4) = 0;
    pMVar1->data = (void *)0x0;
    (this->q_weight_data).refcount = (int *)0x0;
    (this->q_weight_data).dims = 0;
    (this->q_weight_data).w = 0;
    (this->q_weight_data).h = 0;
    (this->q_weight_data).d = 0;
    (this->q_weight_data).c = 0;
    (this->q_weight_data).data = local_78;
    (this->q_weight_data).refcount = piStack_70;
    (this->q_weight_data).elemsize = local_68;
    (this->q_weight_data).elempack = local_60;
    (this->q_weight_data).allocator = local_58;
    (this->q_weight_data).dims = local_50;
    (this->q_weight_data).w = iStack_4c;
    (this->q_weight_data).h = iStack_48;
    (this->q_weight_data).d = iStack_44;
    (this->q_weight_data).c = local_40;
    (this->q_weight_data).cstep = local_38;
  }
  if (piStack_70 != (int *)0x0) {
    LOCK();
    *piStack_70 = *piStack_70 + -1;
    UNLOCK();
    if (*piStack_70 == 0) {
      if (local_58 == (Allocator *)0x0) {
        if (local_78 != (float *)0x0) {
          free(local_78);
        }
      }
      else {
        (*local_58->_vptr_Allocator[3])();
      }
    }
  }
  iVar7 = -100;
  if ((pMVar1->data != (void *)0x0) &&
     ((long)(this->q_weight_data).c * (this->q_weight_data).cstep != 0)) {
    (*mb->_vptr_ModelBin[2])(&local_78,mb,(ulong)(uint)this->embed_dim,1);
    pMVar1 = &this->q_bias_data;
    if (pMVar1 != (Mat *)&local_78) {
      if (piStack_70 != (int *)0x0) {
        LOCK();
        *piStack_70 = *piStack_70 + 1;
        UNLOCK();
      }
      piVar2 = (this->q_bias_data).refcount;
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          pvVar3 = (this->q_bias_data).data;
          pAVar4 = (this->q_bias_data).allocator;
          if (pAVar4 == (Allocator *)0x0) {
            if (pvVar3 != (void *)0x0) {
              free(pvVar3);
            }
          }
          else {
            (*pAVar4->_vptr_Allocator[3])();
          }
        }
      }
      (this->q_bias_data).cstep = 0;
      *(undefined8 *)((long)&(this->q_bias_data).refcount + 4) = 0;
      *(undefined8 *)((long)&(this->q_bias_data).elemsize + 4) = 0;
      pMVar1->data = (void *)0x0;
      (this->q_bias_data).refcount = (int *)0x0;
      (this->q_bias_data).dims = 0;
      (this->q_bias_data).w = 0;
      (this->q_bias_data).h = 0;
      (this->q_bias_data).d = 0;
      (this->q_bias_data).c = 0;
      (this->q_bias_data).data = local_78;
      (this->q_bias_data).refcount = piStack_70;
      (this->q_bias_data).elemsize = local_68;
      (this->q_bias_data).elempack = local_60;
      (this->q_bias_data).allocator = local_58;
      (this->q_bias_data).dims = local_50;
      (this->q_bias_data).w = iStack_4c;
      (this->q_bias_data).h = iStack_48;
      (this->q_bias_data).d = iStack_44;
      (this->q_bias_data).c = local_40;
      (this->q_bias_data).cstep = local_38;
    }
    if (piStack_70 != (int *)0x0) {
      LOCK();
      *piStack_70 = *piStack_70 + -1;
      UNLOCK();
      if (*piStack_70 == 0) {
        if (local_58 == (Allocator *)0x0) {
          if (local_78 != (float *)0x0) {
            free(local_78);
          }
        }
        else {
          (*local_58->_vptr_Allocator[3])();
        }
      }
    }
    if ((pMVar1->data != (void *)0x0) &&
       ((long)(this->q_bias_data).c * (this->q_bias_data).cstep != 0)) {
      (*mb->_vptr_ModelBin[2])(&local_78,mb,(ulong)(uint)(this->kdim * this->embed_dim),0);
      pMVar1 = &this->k_weight_data;
      if (pMVar1 != (Mat *)&local_78) {
        if (piStack_70 != (int *)0x0) {
          LOCK();
          *piStack_70 = *piStack_70 + 1;
          UNLOCK();
        }
        piVar2 = (this->k_weight_data).refcount;
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            pvVar3 = (this->k_weight_data).data;
            pAVar4 = (this->k_weight_data).allocator;
            if (pAVar4 == (Allocator *)0x0) {
              if (pvVar3 != (void *)0x0) {
                free(pvVar3);
              }
            }
            else {
              (*pAVar4->_vptr_Allocator[3])();
            }
          }
        }
        (this->k_weight_data).cstep = 0;
        *(undefined8 *)((long)&(this->k_weight_data).refcount + 4) = 0;
        *(undefined8 *)((long)&(this->k_weight_data).elemsize + 4) = 0;
        pMVar1->data = (void *)0x0;
        (this->k_weight_data).refcount = (int *)0x0;
        (this->k_weight_data).dims = 0;
        (this->k_weight_data).w = 0;
        (this->k_weight_data).h = 0;
        (this->k_weight_data).d = 0;
        (this->k_weight_data).c = 0;
        (this->k_weight_data).data = local_78;
        (this->k_weight_data).refcount = piStack_70;
        (this->k_weight_data).elemsize = local_68;
        (this->k_weight_data).elempack = local_60;
        (this->k_weight_data).allocator = local_58;
        (this->k_weight_data).dims = local_50;
        (this->k_weight_data).w = iStack_4c;
        (this->k_weight_data).h = iStack_48;
        (this->k_weight_data).d = iStack_44;
        (this->k_weight_data).c = local_40;
        (this->k_weight_data).cstep = local_38;
      }
      if (piStack_70 != (int *)0x0) {
        LOCK();
        *piStack_70 = *piStack_70 + -1;
        UNLOCK();
        if (*piStack_70 == 0) {
          if (local_58 == (Allocator *)0x0) {
            if (local_78 != (float *)0x0) {
              free(local_78);
            }
          }
          else {
            (*local_58->_vptr_Allocator[3])();
          }
        }
      }
      if ((pMVar1->data != (void *)0x0) &&
         ((long)(this->k_weight_data).c * (this->k_weight_data).cstep != 0)) {
        (*mb->_vptr_ModelBin[2])(&local_78,mb,(ulong)(uint)this->embed_dim,1);
        pMVar1 = &this->k_bias_data;
        if (pMVar1 != (Mat *)&local_78) {
          if (piStack_70 != (int *)0x0) {
            LOCK();
            *piStack_70 = *piStack_70 + 1;
            UNLOCK();
          }
          piVar2 = (this->k_bias_data).refcount;
          if (piVar2 != (int *)0x0) {
            LOCK();
            *piVar2 = *piVar2 + -1;
            UNLOCK();
            if (*piVar2 == 0) {
              pvVar3 = (this->k_bias_data).data;
              pAVar4 = (this->k_bias_data).allocator;
              if (pAVar4 == (Allocator *)0x0) {
                if (pvVar3 != (void *)0x0) {
                  free(pvVar3);
                }
              }
              else {
                (*pAVar4->_vptr_Allocator[3])();
              }
            }
          }
          (this->k_bias_data).cstep = 0;
          *(undefined8 *)((long)&(this->k_bias_data).refcount + 4) = 0;
          *(undefined8 *)((long)&(this->k_bias_data).elemsize + 4) = 0;
          pMVar1->data = (void *)0x0;
          (this->k_bias_data).refcount = (int *)0x0;
          (this->k_bias_data).dims = 0;
          (this->k_bias_data).w = 0;
          (this->k_bias_data).h = 0;
          (this->k_bias_data).d = 0;
          (this->k_bias_data).c = 0;
          (this->k_bias_data).data = local_78;
          (this->k_bias_data).refcount = piStack_70;
          (this->k_bias_data).elemsize = local_68;
          (this->k_bias_data).elempack = local_60;
          (this->k_bias_data).allocator = local_58;
          (this->k_bias_data).dims = local_50;
          (this->k_bias_data).w = iStack_4c;
          (this->k_bias_data).h = iStack_48;
          (this->k_bias_data).d = iStack_44;
          (this->k_bias_data).c = local_40;
          (this->k_bias_data).cstep = local_38;
        }
        if (piStack_70 != (int *)0x0) {
          LOCK();
          *piStack_70 = *piStack_70 + -1;
          UNLOCK();
          if (*piStack_70 == 0) {
            if (local_58 == (Allocator *)0x0) {
              if (local_78 != (float *)0x0) {
                free(local_78);
              }
            }
            else {
              (*local_58->_vptr_Allocator[3])();
            }
          }
        }
        if ((pMVar1->data != (void *)0x0) &&
           ((long)(this->k_bias_data).c * (this->k_bias_data).cstep != 0)) {
          (*mb->_vptr_ModelBin[2])(&local_78,mb,(ulong)(uint)(this->vdim * this->embed_dim),0);
          pMVar1 = &this->v_weight_data;
          if (pMVar1 != (Mat *)&local_78) {
            if (piStack_70 != (int *)0x0) {
              LOCK();
              *piStack_70 = *piStack_70 + 1;
              UNLOCK();
            }
            piVar2 = (this->v_weight_data).refcount;
            if (piVar2 != (int *)0x0) {
              LOCK();
              *piVar2 = *piVar2 + -1;
              UNLOCK();
              if (*piVar2 == 0) {
                pvVar3 = (this->v_weight_data).data;
                pAVar4 = (this->v_weight_data).allocator;
                if (pAVar4 == (Allocator *)0x0) {
                  if (pvVar3 != (void *)0x0) {
                    free(pvVar3);
                  }
                }
                else {
                  (*pAVar4->_vptr_Allocator[3])();
                }
              }
            }
            (this->v_weight_data).cstep = 0;
            *(undefined8 *)((long)&(this->v_weight_data).refcount + 4) = 0;
            *(undefined8 *)((long)&(this->v_weight_data).elemsize + 4) = 0;
            pMVar1->data = (void *)0x0;
            (this->v_weight_data).refcount = (int *)0x0;
            (this->v_weight_data).dims = 0;
            (this->v_weight_data).w = 0;
            (this->v_weight_data).h = 0;
            (this->v_weight_data).d = 0;
            (this->v_weight_data).c = 0;
            (this->v_weight_data).data = local_78;
            (this->v_weight_data).refcount = piStack_70;
            (this->v_weight_data).elemsize = local_68;
            (this->v_weight_data).elempack = local_60;
            (this->v_weight_data).allocator = local_58;
            (this->v_weight_data).dims = local_50;
            (this->v_weight_data).w = iStack_4c;
            (this->v_weight_data).h = iStack_48;
            (this->v_weight_data).d = iStack_44;
            (this->v_weight_data).c = local_40;
            (this->v_weight_data).cstep = local_38;
          }
          if (piStack_70 != (int *)0x0) {
            LOCK();
            *piStack_70 = *piStack_70 + -1;
            UNLOCK();
            if (*piStack_70 == 0) {
              if (local_58 == (Allocator *)0x0) {
                if (local_78 != (float *)0x0) {
                  free(local_78);
                }
              }
              else {
                (*local_58->_vptr_Allocator[3])();
              }
            }
          }
          if ((pMVar1->data != (void *)0x0) &&
             ((long)(this->v_weight_data).c * (this->v_weight_data).cstep != 0)) {
            (*mb->_vptr_ModelBin[2])(&local_78,mb,(ulong)(uint)this->embed_dim,1);
            pMVar1 = &this->v_bias_data;
            if (pMVar1 != (Mat *)&local_78) {
              if (piStack_70 != (int *)0x0) {
                LOCK();
                *piStack_70 = *piStack_70 + 1;
                UNLOCK();
              }
              piVar2 = (this->v_bias_data).refcount;
              if (piVar2 != (int *)0x0) {
                LOCK();
                *piVar2 = *piVar2 + -1;
                UNLOCK();
                if (*piVar2 == 0) {
                  pvVar3 = (this->v_bias_data).data;
                  pAVar4 = (this->v_bias_data).allocator;
                  if (pAVar4 == (Allocator *)0x0) {
                    if (pvVar3 != (void *)0x0) {
                      free(pvVar3);
                    }
                  }
                  else {
                    (*pAVar4->_vptr_Allocator[3])();
                  }
                }
              }
              (this->v_bias_data).cstep = 0;
              *(undefined8 *)((long)&(this->v_bias_data).refcount + 4) = 0;
              *(undefined8 *)((long)&(this->v_bias_data).elemsize + 4) = 0;
              pMVar1->data = (void *)0x0;
              (this->v_bias_data).refcount = (int *)0x0;
              (this->v_bias_data).dims = 0;
              (this->v_bias_data).w = 0;
              (this->v_bias_data).h = 0;
              (this->v_bias_data).d = 0;
              (this->v_bias_data).c = 0;
              (this->v_bias_data).data = local_78;
              (this->v_bias_data).refcount = piStack_70;
              (this->v_bias_data).elemsize = local_68;
              (this->v_bias_data).elempack = local_60;
              (this->v_bias_data).allocator = local_58;
              (this->v_bias_data).dims = local_50;
              (this->v_bias_data).w = iStack_4c;
              (this->v_bias_data).h = iStack_48;
              (this->v_bias_data).d = iStack_44;
              (this->v_bias_data).c = local_40;
              (this->v_bias_data).cstep = local_38;
            }
            if (piStack_70 != (int *)0x0) {
              LOCK();
              *piStack_70 = *piStack_70 + -1;
              UNLOCK();
              if (*piStack_70 == 0) {
                if (local_58 == (Allocator *)0x0) {
                  if (local_78 != (float *)0x0) {
                    free(local_78);
                  }
                }
                else {
                  (*local_58->_vptr_Allocator[3])();
                }
              }
            }
            if ((pMVar1->data != (void *)0x0) &&
               ((long)(this->v_bias_data).c * (this->v_bias_data).cstep != 0)) {
              (*mb->_vptr_ModelBin[2])(&local_78,mb,(ulong)(uint)(this->embed_dim * iVar6),0);
              pMVar1 = &this->out_weight_data;
              if (pMVar1 != (Mat *)&local_78) {
                if (piStack_70 != (int *)0x0) {
                  LOCK();
                  *piStack_70 = *piStack_70 + 1;
                  UNLOCK();
                }
                piVar2 = (this->out_weight_data).refcount;
                if (piVar2 != (int *)0x0) {
                  LOCK();
                  *piVar2 = *piVar2 + -1;
                  UNLOCK();
                  if (*piVar2 == 0) {
                    pvVar3 = (this->out_weight_data).data;
                    pAVar4 = (this->out_weight_data).allocator;
                    if (pAVar4 == (Allocator *)0x0) {
                      if (pvVar3 != (void *)0x0) {
                        free(pvVar3);
                      }
                    }
                    else {
                      (*pAVar4->_vptr_Allocator[3])();
                    }
                  }
                }
                (this->out_weight_data).cstep = 0;
                *(undefined8 *)((long)&(this->out_weight_data).refcount + 4) = 0;
                *(undefined8 *)((long)&(this->out_weight_data).elemsize + 4) = 0;
                pMVar1->data = (void *)0x0;
                (this->out_weight_data).refcount = (int *)0x0;
                (this->out_weight_data).dims = 0;
                (this->out_weight_data).w = 0;
                (this->out_weight_data).h = 0;
                (this->out_weight_data).d = 0;
                (this->out_weight_data).c = 0;
                (this->out_weight_data).data = local_78;
                (this->out_weight_data).refcount = piStack_70;
                (this->out_weight_data).elemsize = local_68;
                (this->out_weight_data).elempack = local_60;
                (this->out_weight_data).allocator = local_58;
                (this->out_weight_data).dims = local_50;
                (this->out_weight_data).w = iStack_4c;
                (this->out_weight_data).h = iStack_48;
                (this->out_weight_data).d = iStack_44;
                (this->out_weight_data).c = local_40;
                (this->out_weight_data).cstep = local_38;
              }
              if (piStack_70 != (int *)0x0) {
                LOCK();
                *piStack_70 = *piStack_70 + -1;
                UNLOCK();
                if (*piStack_70 == 0) {
                  if (local_58 == (Allocator *)0x0) {
                    if (local_78 != (float *)0x0) {
                      free(local_78);
                    }
                  }
                  else {
                    (*local_58->_vptr_Allocator[3])();
                  }
                }
              }
              if ((pMVar1->data != (void *)0x0) &&
                 ((long)(this->out_weight_data).c * (this->out_weight_data).cstep != 0)) {
                (*mb->_vptr_ModelBin[2])(&local_78,mb,uVar5 & 0xffffffff,1);
                pMVar1 = &this->out_bias_data;
                if (pMVar1 != (Mat *)&local_78) {
                  if (piStack_70 != (int *)0x0) {
                    LOCK();
                    *piStack_70 = *piStack_70 + 1;
                    UNLOCK();
                  }
                  piVar2 = (this->out_bias_data).refcount;
                  if (piVar2 != (int *)0x0) {
                    LOCK();
                    *piVar2 = *piVar2 + -1;
                    UNLOCK();
                    if (*piVar2 == 0) {
                      pvVar3 = (this->out_bias_data).data;
                      pAVar4 = (this->out_bias_data).allocator;
                      if (pAVar4 == (Allocator *)0x0) {
                        if (pvVar3 != (void *)0x0) {
                          free(pvVar3);
                        }
                      }
                      else {
                        (*pAVar4->_vptr_Allocator[3])();
                      }
                    }
                  }
                  (this->out_bias_data).cstep = 0;
                  *(undefined8 *)((long)&(this->out_bias_data).refcount + 4) = 0;
                  *(undefined8 *)((long)&(this->out_bias_data).elemsize + 4) = 0;
                  pMVar1->data = (void *)0x0;
                  (this->out_bias_data).refcount = (int *)0x0;
                  (this->out_bias_data).dims = 0;
                  (this->out_bias_data).w = 0;
                  (this->out_bias_data).h = 0;
                  (this->out_bias_data).d = 0;
                  (this->out_bias_data).c = 0;
                  (this->out_bias_data).data = local_78;
                  (this->out_bias_data).refcount = piStack_70;
                  (this->out_bias_data).elemsize = local_68;
                  (this->out_bias_data).elempack = local_60;
                  (this->out_bias_data).allocator = local_58;
                  (this->out_bias_data).dims = local_50;
                  (this->out_bias_data).w = iStack_4c;
                  (this->out_bias_data).h = iStack_48;
                  (this->out_bias_data).d = iStack_44;
                  (this->out_bias_data).c = local_40;
                  (this->out_bias_data).cstep = local_38;
                }
                if (piStack_70 != (int *)0x0) {
                  LOCK();
                  *piStack_70 = *piStack_70 + -1;
                  UNLOCK();
                  if (*piStack_70 == 0) {
                    if (local_58 == (Allocator *)0x0) {
                      if (local_78 != (float *)0x0) {
                        free(local_78);
                      }
                    }
                    else {
                      (*local_58->_vptr_Allocator[3])();
                    }
                  }
                }
                if ((pMVar1->data != (void *)0x0) &&
                   ((long)(this->out_bias_data).c * (this->out_bias_data).cstep != 0)) {
                  iVar6 = 0;
                  iVar7 = 0;
                  if (this->int8_scale_term != 0) {
                    (*mb->_vptr_ModelBin[2])(&local_78,mb,(ulong)(uint)this->embed_dim,1);
                    if (&this->q_weight_data_int8_scales != (Mat *)&local_78) {
                      if (piStack_70 != (int *)0x0) {
                        LOCK();
                        *piStack_70 = *piStack_70 + 1;
                        UNLOCK();
                      }
                      piVar2 = (this->q_weight_data_int8_scales).refcount;
                      if (piVar2 != (int *)0x0) {
                        LOCK();
                        *piVar2 = *piVar2 + -1;
                        UNLOCK();
                        if (*piVar2 == 0) {
                          pvVar3 = (this->q_weight_data_int8_scales).data;
                          pAVar4 = (this->q_weight_data_int8_scales).allocator;
                          if (pAVar4 == (Allocator *)0x0) {
                            if (pvVar3 != (void *)0x0) {
                              free(pvVar3);
                            }
                          }
                          else {
                            (*pAVar4->_vptr_Allocator[3])();
                          }
                        }
                      }
                      (this->q_weight_data_int8_scales).cstep = 0;
                      *(undefined8 *)((long)&(this->q_weight_data_int8_scales).refcount + 4) = 0;
                      *(undefined8 *)((long)&(this->q_weight_data_int8_scales).elemsize + 4) = 0;
                      (this->q_weight_data_int8_scales).data = (void *)0x0;
                      (this->q_weight_data_int8_scales).refcount = (int *)0x0;
                      (this->q_weight_data_int8_scales).dims = 0;
                      (this->q_weight_data_int8_scales).w = 0;
                      (this->q_weight_data_int8_scales).h = 0;
                      (this->q_weight_data_int8_scales).d = 0;
                      (this->q_weight_data_int8_scales).c = 0;
                      (this->q_weight_data_int8_scales).data = local_78;
                      (this->q_weight_data_int8_scales).refcount = piStack_70;
                      (this->q_weight_data_int8_scales).elemsize = local_68;
                      (this->q_weight_data_int8_scales).elempack = local_60;
                      (this->q_weight_data_int8_scales).allocator = local_58;
                      (this->q_weight_data_int8_scales).dims = local_50;
                      (this->q_weight_data_int8_scales).w = iStack_4c;
                      (this->q_weight_data_int8_scales).h = iStack_48;
                      (this->q_weight_data_int8_scales).d = iStack_44;
                      (this->q_weight_data_int8_scales).c = local_40;
                      (this->q_weight_data_int8_scales).cstep = local_38;
                    }
                    if (piStack_70 != (int *)0x0) {
                      LOCK();
                      *piStack_70 = *piStack_70 + -1;
                      UNLOCK();
                      if (*piStack_70 == 0) {
                        if (local_58 == (Allocator *)0x0) {
                          if (local_78 != (float *)0x0) {
                            free(local_78);
                          }
                        }
                        else {
                          (*local_58->_vptr_Allocator[3])();
                        }
                      }
                    }
                    (*mb->_vptr_ModelBin[2])(&local_78,mb,(ulong)(uint)this->embed_dim,1);
                    if (&this->k_weight_data_int8_scales != (Mat *)&local_78) {
                      if (piStack_70 != (int *)0x0) {
                        LOCK();
                        *piStack_70 = *piStack_70 + 1;
                        UNLOCK();
                      }
                      piVar2 = (this->k_weight_data_int8_scales).refcount;
                      if (piVar2 != (int *)0x0) {
                        LOCK();
                        *piVar2 = *piVar2 + -1;
                        UNLOCK();
                        if (*piVar2 == 0) {
                          pvVar3 = (this->k_weight_data_int8_scales).data;
                          pAVar4 = (this->k_weight_data_int8_scales).allocator;
                          if (pAVar4 == (Allocator *)0x0) {
                            if (pvVar3 != (void *)0x0) {
                              free(pvVar3);
                            }
                          }
                          else {
                            (*pAVar4->_vptr_Allocator[3])();
                          }
                        }
                      }
                      (this->k_weight_data_int8_scales).cstep = 0;
                      *(undefined8 *)((long)&(this->k_weight_data_int8_scales).refcount + 4) = 0;
                      *(undefined8 *)((long)&(this->k_weight_data_int8_scales).elemsize + 4) = 0;
                      (this->k_weight_data_int8_scales).data = (void *)0x0;
                      (this->k_weight_data_int8_scales).refcount = (int *)0x0;
                      (this->k_weight_data_int8_scales).dims = 0;
                      (this->k_weight_data_int8_scales).w = 0;
                      (this->k_weight_data_int8_scales).h = 0;
                      (this->k_weight_data_int8_scales).d = 0;
                      (this->k_weight_data_int8_scales).c = 0;
                      (this->k_weight_data_int8_scales).data = local_78;
                      (this->k_weight_data_int8_scales).refcount = piStack_70;
                      (this->k_weight_data_int8_scales).elemsize = local_68;
                      (this->k_weight_data_int8_scales).elempack = local_60;
                      (this->k_weight_data_int8_scales).allocator = local_58;
                      (this->k_weight_data_int8_scales).dims = local_50;
                      (this->k_weight_data_int8_scales).w = iStack_4c;
                      (this->k_weight_data_int8_scales).h = iStack_48;
                      (this->k_weight_data_int8_scales).d = iStack_44;
                      (this->k_weight_data_int8_scales).c = local_40;
                      (this->k_weight_data_int8_scales).cstep = local_38;
                    }
                    if (piStack_70 != (int *)0x0) {
                      LOCK();
                      *piStack_70 = *piStack_70 + -1;
                      UNLOCK();
                      if (*piStack_70 == 0) {
                        if (local_58 == (Allocator *)0x0) {
                          if (local_78 != (float *)0x0) {
                            free(local_78);
                          }
                        }
                        else {
                          (*local_58->_vptr_Allocator[3])();
                        }
                      }
                    }
                    (*mb->_vptr_ModelBin[2])(&local_78,mb,(ulong)(uint)this->embed_dim,1);
                    if (&this->v_weight_data_int8_scales != (Mat *)&local_78) {
                      if (piStack_70 != (int *)0x0) {
                        LOCK();
                        *piStack_70 = *piStack_70 + 1;
                        UNLOCK();
                      }
                      piVar2 = (this->v_weight_data_int8_scales).refcount;
                      if (piVar2 != (int *)0x0) {
                        LOCK();
                        *piVar2 = *piVar2 + -1;
                        UNLOCK();
                        if (*piVar2 == 0) {
                          pvVar3 = (this->v_weight_data_int8_scales).data;
                          pAVar4 = (this->v_weight_data_int8_scales).allocator;
                          if (pAVar4 == (Allocator *)0x0) {
                            if (pvVar3 != (void *)0x0) {
                              free(pvVar3);
                            }
                          }
                          else {
                            (*pAVar4->_vptr_Allocator[3])();
                          }
                        }
                      }
                      (this->v_weight_data_int8_scales).cstep = 0;
                      *(undefined8 *)((long)&(this->v_weight_data_int8_scales).refcount + 4) = 0;
                      *(undefined8 *)((long)&(this->v_weight_data_int8_scales).elemsize + 4) = 0;
                      (this->v_weight_data_int8_scales).data = (void *)0x0;
                      (this->v_weight_data_int8_scales).refcount = (int *)0x0;
                      (this->v_weight_data_int8_scales).dims = 0;
                      (this->v_weight_data_int8_scales).w = 0;
                      (this->v_weight_data_int8_scales).h = 0;
                      (this->v_weight_data_int8_scales).d = 0;
                      (this->v_weight_data_int8_scales).c = 0;
                      (this->v_weight_data_int8_scales).data = local_78;
                      (this->v_weight_data_int8_scales).refcount = piStack_70;
                      (this->v_weight_data_int8_scales).elemsize = local_68;
                      (this->v_weight_data_int8_scales).elempack = local_60;
                      (this->v_weight_data_int8_scales).allocator = local_58;
                      (this->v_weight_data_int8_scales).dims = local_50;
                      (this->v_weight_data_int8_scales).w = iStack_4c;
                      (this->v_weight_data_int8_scales).h = iStack_48;
                      (this->v_weight_data_int8_scales).d = iStack_44;
                      (this->v_weight_data_int8_scales).c = local_40;
                      (this->v_weight_data_int8_scales).cstep = local_38;
                    }
                    if (piStack_70 != (int *)0x0) {
                      LOCK();
                      *piStack_70 = *piStack_70 + -1;
                      UNLOCK();
                      if (*piStack_70 == 0) {
                        if (local_58 == (Allocator *)0x0) {
                          if (local_78 != (float *)0x0) {
                            free(local_78);
                          }
                        }
                        else {
                          (*local_58->_vptr_Allocator[3])();
                        }
                      }
                    }
                    (*mb->_vptr_ModelBin[2])(&local_78,mb,1,1);
                    this->out_weight_data_int8_scale = *local_78;
                    iVar7 = iVar6;
                    if (piStack_70 != (int *)0x0) {
                      LOCK();
                      *piStack_70 = *piStack_70 + -1;
                      UNLOCK();
                      if (*piStack_70 == 0) {
                        if (local_58 == (Allocator *)0x0) {
                          if (local_78 != (float *)0x0) {
                            free(local_78);
                          }
                        }
                        else {
                          (*local_58->_vptr_Allocator[3])();
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return iVar7;
}

Assistant:

int MultiHeadAttention::load_model(const ModelBin& mb)
{
    const int qdim = weight_data_size / embed_dim;

    q_weight_data = mb.load(embed_dim * qdim, 0);
    if (q_weight_data.empty())
        return -100;

    q_bias_data = mb.load(embed_dim, 1);
    if (q_bias_data.empty())
        return -100;

    k_weight_data = mb.load(embed_dim * kdim, 0);
    if (k_weight_data.empty())
        return -100;

    k_bias_data = mb.load(embed_dim, 1);
    if (k_bias_data.empty())
        return -100;

    v_weight_data = mb.load(embed_dim * vdim, 0);
    if (v_weight_data.empty())
        return -100;

    v_bias_data = mb.load(embed_dim, 1);
    if (v_bias_data.empty())
        return -100;

    out_weight_data = mb.load(qdim * embed_dim, 0);
    if (out_weight_data.empty())
        return -100;

    out_bias_data = mb.load(qdim, 1);
    if (out_bias_data.empty())
        return -100;

#if NCNN_INT8
    if (int8_scale_term)
    {
        q_weight_data_int8_scales = mb.load(embed_dim, 1);
        k_weight_data_int8_scales = mb.load(embed_dim, 1);
        v_weight_data_int8_scales = mb.load(embed_dim, 1);
        out_weight_data_int8_scale = mb.load(1, 1)[0];
    }
#endif // NCNN_INT8

    return 0;
}